

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO1Quad<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO1Quad<double> *this,
          MatrixXd *refcoords)

{
  PointerType pdVar1;
  ulong uVar2;
  long lVar3;
  Scalar *dataPtr;
  undefined8 uVar4;
  variable_if_dynamic<long,__1> vVar5;
  double *pdVar6;
  double *pdVar7;
  Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> temp;
  stringstream ss;
  scalar_difference_op<double,_double> local_2a9;
  undefined1 local_2a8 [32];
  variable_if_dynamic<long,__1> local_288;
  variable_if_dynamic<long,__1> vStack_280;
  Index local_278;
  XprTypeNested local_268;
  scalar_constant_op<double> local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  variable_if_dynamic<long,__1> local_238;
  variable_if_dynamic<long,__1> vStack_230;
  Index local_228;
  undefined1 local_208 [32];
  variable_if_dynamic<long,__1> local_1e8;
  variable_if_dynamic<long,__1> vStack_1e0;
  Index local_1d8;
  Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1d0;
  undefined1 local_1b0 [16];
  variable_if_dynamic<long,__1> local_1a0;
  scalar_constant_op<double> local_198;
  variable_if_dynamic<long,__1> local_190;
  variable_if_dynamic<long,__1> local_178;
  scalar_constant_op<double> local_168;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Reference coordinates must be 2-vectors",0x27);
    local_258._0_8_ = &local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"refcoords.rows() == 2","");
    pdVar1 = (PointerType)(local_2a8 + 0x10);
    local_2a8._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_258,(string *)local_2a8,0xeb,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((PointerType)local_2a8._0_8_ != pdVar1) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ != &local_248) {
      operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
    }
    local_258._0_8_ = &local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"false","");
    local_2a8._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
    base::AssertionFailed((string *)local_258,(string *)local_2a8,0xeb,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_258);
    abort();
  }
  uVar2 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,4,
             (ulong)(uint)((int)uVar2 * 2));
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       __return_storage_ptr__,0,0);
  Eigen::MapBase<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)&local_1d0,dataPtr,8,uVar2 & 0xffffffff);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
             refcoords,1);
  local_278 = local_1d8;
  local_288.m_value = local_1e8.m_value;
  vStack_280.m_value = vStack_1e0.m_value;
  local_2a8._16_8_ = local_208._16_8_;
  local_2a8._24_8_ = local_208._24_8_;
  local_2a8._0_8_ = local_208._0_8_;
  local_2a8._8_8_ = local_208._8_8_;
  local_260.m_other = 1.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_258,1,local_208._16_8_,&local_260);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_1b0,(Lhs *)local_2a8,(Rhs *)local_258,&local_2a9);
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_258,&local_1d0,0);
  pdVar7 = (double *)local_1b0._0_8_;
  lVar3 = *(Index *)((long)local_198.m_other + 8);
  local_268 = (XprTypeNested)local_168.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_258,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
              *)local_1b0,(assign_op<double,_double> *)&local_260);
  uVar4 = local_248._M_allocated_capacity;
  pdVar6 = (double *)local_258._0_8_;
  if (0 < (long)local_248._M_allocated_capacity) {
    do {
      *pdVar6 = *pdVar7 - (double)local_268;
      pdVar7 = pdVar7 + lVar3;
      uVar4 = uVar4 + -1;
      pdVar6 = pdVar6 + local_238.m_value;
    } while ((double)uVar4 != 0.0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
             refcoords,1);
  local_278 = local_1d8;
  local_288.m_value = local_1e8.m_value;
  vStack_280.m_value = vStack_1e0.m_value;
  local_2a8._16_8_ = local_208._16_8_;
  local_2a8._24_8_ = local_208._24_8_;
  local_2a8._0_8_ = local_208._0_8_;
  local_2a8._8_8_ = local_208._8_8_;
  local_260.m_other = 1.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_258,1,local_208._16_8_,&local_260);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                   *)local_1b0,(Lhs *)local_258,(Rhs *)local_2a8,&local_2a9);
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_258,&local_1d0,1);
  vVar5.m_value = local_190.m_value;
  local_268 = (XprTypeNested)local_198.m_other;
  lVar3 = *(Index *)(local_178.m_value + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_258,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)local_1b0,(assign_op<double,_double> *)&local_260);
  if (0 < (long)local_248._M_allocated_capacity) {
    do {
      *(double *)local_258._0_8_ = (double)local_268 - *(double *)vVar5.m_value;
      vVar5.m_value = vVar5.m_value + lVar3 * 8;
      local_258._0_8_ = local_258._0_8_ + local_238.m_value * 8;
      local_248._M_allocated_capacity = local_248._M_allocated_capacity + -1;
    } while ((double)local_248._M_allocated_capacity != 0.0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2a8,
             refcoords,1);
  local_228 = local_278;
  local_238.m_value = local_288.m_value;
  vStack_230.m_value = vStack_280.m_value;
  local_248._M_allocated_capacity = local_2a8._16_8_;
  local_248._8_8_ = local_2a8._24_8_;
  local_258._0_8_ = local_2a8._0_8_;
  local_258._8_8_ = local_2a8._8_8_;
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_1b0,&local_1d0,2);
  pdVar7 = (double *)local_258._0_8_;
  lVar3 = *(Index *)(local_248._8_8_ + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_1b0,
             (ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_258,(assign_op<double,_double> *)local_208);
  vVar5.m_value = local_1a0.m_value;
  pdVar6 = (double *)local_1b0._0_8_;
  if (0 < local_1a0.m_value) {
    do {
      *pdVar6 = *pdVar7;
      pdVar7 = pdVar7 + lVar3;
      vVar5.m_value = vVar5.m_value + -1;
      pdVar6 = pdVar6 + local_190.m_value;
    } while (vVar5.m_value != 0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2a8,
             refcoords,1);
  local_228 = local_278;
  local_238.m_value = local_288.m_value;
  vStack_230.m_value = vStack_280.m_value;
  local_248._M_allocated_capacity = local_2a8._16_8_;
  local_248._8_8_ = local_2a8._24_8_;
  local_258._0_8_ = local_2a8._0_8_;
  local_258._8_8_ = local_2a8._8_8_;
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_1b0,&local_1d0,3);
  pdVar7 = (double *)local_258._0_8_;
  lVar3 = *(Index *)(local_248._8_8_ + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_1b0,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)local_258,(assign_op<double,_double> *)local_208);
  vVar5.m_value = local_1a0.m_value;
  pdVar6 = (double *)local_1b0._0_8_;
  if (0 < local_1a0.m_value) {
    do {
      *pdVar6 = -*pdVar7;
      pdVar7 = pdVar7 + lVar3;
      vVar5.m_value = vVar5.m_value + -1;
      pdVar6 = pdVar6 + local_190.m_value;
    } while (vVar5.m_value != 0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
             refcoords,0);
  local_278 = local_1d8;
  local_288.m_value = local_1e8.m_value;
  vStack_280.m_value = vStack_1e0.m_value;
  local_2a8._16_8_ = local_208._16_8_;
  local_2a8._24_8_ = local_208._24_8_;
  local_2a8._0_8_ = local_208._0_8_;
  local_2a8._8_8_ = local_208._8_8_;
  local_260.m_other = 1.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_258,1,local_208._16_8_,&local_260);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_1b0,(Lhs *)local_2a8,(Rhs *)local_258,&local_2a9);
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_258,&local_1d0,4);
  pdVar7 = (double *)local_1b0._0_8_;
  lVar3 = *(Index *)((long)local_198.m_other + 8);
  local_268 = (XprTypeNested)local_168.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_258,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
              *)local_1b0,(assign_op<double,_double> *)&local_260);
  uVar4 = local_248._M_allocated_capacity;
  pdVar6 = (double *)local_258._0_8_;
  if (0 < (long)local_248._M_allocated_capacity) {
    do {
      *pdVar6 = *pdVar7 - (double)local_268;
      pdVar7 = pdVar7 + lVar3;
      uVar4 = uVar4 + -1;
      pdVar6 = pdVar6 + local_238.m_value;
    } while ((double)uVar4 != 0.0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2a8,
             refcoords,0);
  local_228 = local_278;
  local_238.m_value = local_288.m_value;
  vStack_230.m_value = vStack_280.m_value;
  local_248._M_allocated_capacity = local_2a8._16_8_;
  local_248._8_8_ = local_2a8._24_8_;
  local_258._0_8_ = local_2a8._0_8_;
  local_258._8_8_ = local_2a8._8_8_;
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_1b0,&local_1d0,5);
  pdVar7 = (double *)local_258._0_8_;
  lVar3 = *(Index *)(local_248._8_8_ + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_1b0,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)local_258,(assign_op<double,_double> *)local_208);
  vVar5.m_value = local_1a0.m_value;
  pdVar6 = (double *)local_1b0._0_8_;
  if (0 < local_1a0.m_value) {
    do {
      *pdVar6 = -*pdVar7;
      pdVar7 = pdVar7 + lVar3;
      vVar5.m_value = vVar5.m_value + -1;
      pdVar6 = pdVar6 + local_190.m_value;
    } while (vVar5.m_value != 0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2a8,
             refcoords,0);
  local_228 = local_278;
  local_238.m_value = local_288.m_value;
  vStack_230.m_value = vStack_280.m_value;
  local_248._M_allocated_capacity = local_2a8._16_8_;
  local_248._8_8_ = local_2a8._24_8_;
  local_258._0_8_ = local_2a8._0_8_;
  local_258._8_8_ = local_2a8._8_8_;
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_1b0,&local_1d0,6);
  pdVar7 = (double *)local_258._0_8_;
  lVar3 = *(Index *)(local_248._8_8_ + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_1b0,
             (ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_258,(assign_op<double,_double> *)local_208);
  if (0 < local_1a0.m_value) {
    do {
      *(double *)local_1b0._0_8_ = *pdVar7;
      pdVar7 = pdVar7 + lVar3;
      local_1b0._0_8_ = local_1b0._0_8_ + local_190.m_value * 8;
      local_1a0.m_value = local_1a0.m_value + -1;
    } while (local_1a0.m_value != 0);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
             refcoords,0);
  local_278 = local_1d8;
  local_288.m_value = local_1e8.m_value;
  vStack_280.m_value = vStack_1e0.m_value;
  local_2a8._16_8_ = local_208._16_8_;
  local_2a8._24_8_ = local_208._24_8_;
  local_2a8._0_8_ = local_208._0_8_;
  local_2a8._8_8_ = local_208._8_8_;
  local_260.m_other = 1.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_258,1,local_208._16_8_,&local_260);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                   *)local_1b0,(Lhs *)local_258,(Rhs *)local_2a8,&local_2a9);
  Eigen::
  Block<Eigen::Map<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>
  ::Block((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
           *)local_258,&local_1d0,7);
  local_268 = (XprTypeNested)local_198.m_other;
  lVar3 = *(Index *)(local_178.m_value + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Map<Eigen::Array<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>,double,double>
            ((Block<Eigen::Map<Eigen::Array<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>
              *)local_258,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)local_1b0,(assign_op<double,_double> *)&local_260);
  if (0 < (long)local_248._M_allocated_capacity) {
    do {
      *(double *)local_258._0_8_ = (double)local_268 - *(double *)local_190.m_value;
      local_190.m_value = local_190.m_value + lVar3 * 8;
      local_258._0_8_ = local_258._0_8_ + local_238.m_value * 8;
      local_248._M_allocated_capacity = local_248._M_allocated_capacity + -1;
    } while ((double)local_248._M_allocated_capacity != 0.0);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    const size_type n_pts(refcoords.cols());

    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(4, 2 * n_pts);

    // reshape the result matrix into a 8xn_pts matrix
    Eigen::Map<Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic>,
               Eigen::AutoAlign>
        temp(&result(0, 0), 8, n_pts);
    temp.row(0) = refcoords.row(1).array() - 1.0;
    temp.row(1) = 1.0 - refcoords.row(1).array();
    temp.row(2) = refcoords.row(1).array();
    temp.row(3) = -refcoords.row(1).array();
    temp.row(4) = refcoords.row(0).array() - 1.0;
    temp.row(5) = -refcoords.row(0).array();
    temp.row(6) = refcoords.row(0).array();
    temp.row(7) = 1.0 - refcoords.row(0).array();

    return result;
  }